

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkBends(MoleculeStamp *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  AtomStamp *this_00;
  reference piVar8;
  reference pvVar9;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar10;
  BendStamp *newBendStamp_1;
  type_conflict *third_2;
  type_conflict *second_2;
  type_conflict *first_2;
  tuple<int,_int,_int> newBend_1;
  int c_1;
  BendStamp *newBendStamp;
  type_conflict *third_1;
  type_conflict *second_1;
  type_conflict *first_1;
  tuple<int,_int,_int> newBend;
  int c;
  AtomIter ai;
  AtomStamp *atomB;
  AtomStamp *atomA;
  int b;
  int a;
  BondStamp *bondStamp;
  size_t i_3;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  tuple<int,_int,_int> bendTuple;
  iterator j_2;
  int ghostIndex_1;
  vector<int,_std::allocator<int>_> bend;
  BendStamp *bendStamp_2;
  size_t i_2;
  iterator iter;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  int rigidbodyIndex;
  iterator j_1;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> bendAtoms_1;
  BendStamp *bendStamp_1;
  size_t i_1;
  size_t ghostIndex;
  iterator k;
  iterator j;
  vector<int,_std::allocator<int>_> bendAtoms;
  BendStamp *bendStamp;
  size_t i;
  ostringstream oss;
  undefined4 in_stack_fffffffffffff568;
  int in_stack_fffffffffffff56c;
  MoleculeStamp *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff580;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff588;
  int in_stack_fffffffffffff590;
  int in_stack_fffffffffffff594;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff598;
  undefined7 in_stack_fffffffffffff5a0;
  undefined1 in_stack_fffffffffffff5a7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff5a8;
  undefined7 in_stack_fffffffffffff5f8;
  undefined1 in_stack_fffffffffffff5ff;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> in_stack_fffffffffffff600;
  const_iterator in_stack_fffffffffffff608;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff610;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff660;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff718;
  bool local_7e1;
  _Self local_780;
  _Self local_778;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *local_770;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *local_768;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *local_760;
  undefined8 local_754;
  undefined4 local_74c;
  undefined8 local_748;
  undefined4 local_740;
  int local_73c;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *local_738;
  _Base_ptr local_730;
  undefined1 local_728;
  _Self local_720;
  _Self local_718;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *local_710;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *local_708;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *local_700;
  undefined8 local_6f4;
  undefined4 local_6ec;
  undefined8 local_6e8;
  undefined4 local_6e0;
  int local_6dc;
  _Rb_tree_const_iterator<int> local_6d8;
  AtomStamp *local_6d0;
  AtomStamp *local_6c8;
  int local_6c0;
  int local_6bc;
  BondStamp *local_6b8;
  ulong local_6b0;
  _Base_ptr local_6a8;
  undefined1 local_6a0;
  undefined1 local_691;
  string local_670 [32];
  string local_650 [32];
  _Self local_630;
  _Base_ptr local_628;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *local_620;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *local_618;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *local_610;
  undefined1 *local_608;
  undefined1 local_5fc [12];
  int *local_5f0;
  int *local_5e0;
  int *local_5d8;
  int *local_5d0;
  int *local_5c8;
  int local_5bc;
  vector<int,_std::allocator<int>_> local_5b8;
  BendStamp *local_5a0;
  ulong local_598;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_590 [7];
  undefined1 local_551;
  string local_530 [32];
  string local_510 [36];
  int local_4ec;
  int *local_4e8;
  int *local_4e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4d8;
  undefined4 local_4cc;
  vector<int,_std::allocator<int>_> local_4c8 [2];
  BendStamp *local_498;
  ulong local_490;
  undefined1 local_481;
  string local_460 [39];
  undefined1 local_439;
  string local_418 [39];
  undefined1 local_3f1;
  string local_3d0 [39];
  undefined1 local_3a9;
  string local_388 [32];
  int *local_368;
  int *local_360;
  int *local_358;
  int *local_350;
  ulong local_348;
  undefined1 local_339;
  string local_318 [39];
  undefined1 local_2f1;
  string local_2d0 [32];
  string local_2b0 [39];
  undefined1 local_289;
  string local_268 [32];
  string local_248 [32];
  int *local_228;
  int *local_220;
  undefined4 local_218;
  int *local_208;
  int *local_200;
  int *local_1f8;
  long local_1f0;
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  BendStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  do {
    uVar1 = local_188;
    sVar4 = getNBends((MoleculeStamp *)0x325c55);
    if (sVar4 <= uVar1) {
      local_490 = 0;
      do {
        uVar1 = local_490;
        sVar4 = getNBends((MoleculeStamp *)0x326c3f);
        if (sVar4 <= uVar1) {
          std::
          set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
          ::set((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 *)0x3270ab);
          std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::_Rb_tree_const_iterator
                    (local_590);
          local_598 = 0;
          while( true ) {
            uVar1 = local_598;
            sVar4 = getNBends((MoleculeStamp *)0x3270e1);
            if (sVar4 <= uVar1) {
              for (local_6b0 = 0; uVar1 = local_6b0, sVar4 = getNBonds((MoleculeStamp *)0x327699),
                  uVar1 < sVar4; local_6b0 = local_6b0 + 1) {
                local_6b8 = getBondStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
                local_6bc = BondStamp::getA(local_6b8);
                local_6c0 = BondStamp::getB(local_6b8);
                local_6c8 = getAtomStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
                local_6d0 = getAtomStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
                std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_6d8);
                local_6dc = AtomStamp::getFirstBondedAtom
                                      ((AtomStamp *)
                                       CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590)
                                       ,(AtomIter *)in_stack_fffffffffffff588._M_current);
                while (local_6dc != -1) {
                  if (local_6c0 != local_6dc) {
                    std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                              ((tuple<int,_int,_int> *)in_stack_fffffffffffff580._M_current,
                               (int *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                               (int *)in_stack_fffffffffffff570,
                               (int *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568))
                    ;
                    local_6f4 = local_6e8;
                    local_6ec = local_6e0;
                    local_700 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x327818);
                    local_708 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x32782d);
                    local_710 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x327842);
                    if (*local_710 < *local_700) {
                      std::swap<int>(local_700,local_710);
                    }
                    local_718._M_node =
                         (_Base_ptr)
                         std::
                         set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ::find((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                                (key_type *)in_stack_fffffffffffff570);
                    local_720._M_node =
                         (_Base_ptr)
                         std::
                         set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ::end((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
                    bVar2 = std::operator==(&local_718,&local_720);
                    if (bVar2) {
                      pVar10 = std::
                               set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               ::insert((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff594,
                                                    in_stack_fffffffffffff590),
                                        (value_type *)in_stack_fffffffffffff588._M_current);
                      local_730 = (_Base_ptr)pVar10.first._M_node;
                      in_stack_fffffffffffff5a7 = pVar10.second;
                      local_728 = in_stack_fffffffffffff5a7;
                      in_stack_fffffffffffff598._M_current = (int *)operator_new(0xf0);
                      BendStamp::BendStamp((BendStamp *)in_stack_fffffffffffff660._M_current);
                      local_738 = (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *)
                                  in_stack_fffffffffffff598._M_current;
                      BendStamp::setMembers
                                ((BendStamp *)
                                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                                 (tuple<int,_int,_int> *)in_stack_fffffffffffff598._M_current);
                      addBendStamp(in_stack_fffffffffffff570,
                                   (BendStamp *)
                                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
                    }
                  }
                  in_stack_fffffffffffff594 =
                       AtomStamp::getNextBondedAtom
                                 ((AtomStamp *)
                                  CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                                  (AtomIter *)in_stack_fffffffffffff588._M_current);
                  local_6dc = in_stack_fffffffffffff594;
                }
                in_stack_fffffffffffff590 =
                     AtomStamp::getFirstBondedAtom
                               ((AtomStamp *)
                                CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                                (AtomIter *)in_stack_fffffffffffff588._M_current);
                local_73c = in_stack_fffffffffffff590;
                while (local_73c != -1) {
                  if (local_6bc != local_73c) {
                    std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                              ((tuple<int,_int,_int> *)in_stack_fffffffffffff580._M_current,
                               (int *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                               (int *)in_stack_fffffffffffff570,
                               (int *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568))
                    ;
                    local_754 = local_748;
                    local_74c = local_740;
                    local_760 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x327a51);
                    local_768 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x327a66);
                    local_770 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x327a7b);
                    if (*local_770 < *local_760) {
                      std::swap<int>(local_760,local_770);
                    }
                    in_stack_fffffffffffff588._M_current =
                         (int *)std::
                                set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                ::find((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                        *)CONCAT17(in_stack_fffffffffffff57f,
                                                   in_stack_fffffffffffff578),
                                       (key_type *)in_stack_fffffffffffff570);
                    local_778._M_node = (_Base_ptr)in_stack_fffffffffffff588._M_current;
                    local_780._M_node =
                         (_Base_ptr)
                         std::
                         set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ::end((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
                    bVar2 = std::operator==(&local_778,&local_780);
                    if (bVar2) {
                      pVar10 = std::
                               set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               ::insert((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff594,
                                                    in_stack_fffffffffffff590),
                                        (value_type *)in_stack_fffffffffffff588._M_current);
                      in_stack_fffffffffffff580._M_current = (int *)pVar10.first._M_node;
                      in_stack_fffffffffffff57f = pVar10.second;
                      in_stack_fffffffffffff570 = (MoleculeStamp *)operator_new(0xf0);
                      BendStamp::BendStamp((BendStamp *)in_stack_fffffffffffff660._M_current);
                      BendStamp::setMembers
                                ((BendStamp *)
                                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                                 (tuple<int,_int,_int> *)in_stack_fffffffffffff598._M_current);
                      addBendStamp(in_stack_fffffffffffff570,
                                   (BendStamp *)
                                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
                    }
                  }
                  in_stack_fffffffffffff56c =
                       AtomStamp::getNextBondedAtom
                                 ((AtomStamp *)
                                  CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                                  (AtomIter *)in_stack_fffffffffffff588._M_current);
                  local_73c = in_stack_fffffffffffff56c;
                }
              }
              std::
              set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ::~set((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)0x327c16);
              std::__cxx11::ostringstream::~ostringstream(local_180);
              return;
            }
            local_5a0 = getBendStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
            BendStamp::getMembers
                      ((BendStamp *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
            sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_5b8);
            if (sVar5 == 2) {
              local_5bc = BendStamp::getGhostVectorSource((BendStamp *)0x32716d);
              local_5d0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff56c,
                                                     in_stack_fffffffffffff568));
              local_5d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff56c,
                                                     in_stack_fffffffffffff568));
              in_stack_fffffffffffff660 =
                   std::
                   find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                             (in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                              (int *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
              local_5c8 = in_stack_fffffffffffff660._M_current;
              local_5e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff56c,
                                                     in_stack_fffffffffffff568));
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff570,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
              if (bVar2) {
                __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                __normal_iterator<int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffff570,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
                local_5f0 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                             ((vector<int,_std::allocator<int>_> *)
                                              in_stack_fffffffffffff600._M_node,
                                              in_stack_fffffffffffff608,
                                              (value_type_conflict1 *)
                                              CONCAT17(in_stack_fffffffffffff5ff,
                                                       in_stack_fffffffffffff5f8));
              }
            }
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,1);
            std::vector<int,_std::allocator<int>_>::operator[](&local_5b8,2);
            std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff580._M_current,
                       (int *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                       (int *)in_stack_fffffffffffff570,
                       (int *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
            local_608 = local_5fc;
            local_610 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x327324);
            local_618 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x327339);
            local_620 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x32734e);
            if (*local_620 < *local_610) {
              std::swap<int>(local_610,local_620);
            }
            local_628 = (_Base_ptr)
                        std::
                        set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ::find((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                               (key_type *)in_stack_fffffffffffff570);
            local_590[0]._M_node = local_628;
            local_630._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::end((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
            bVar2 = std::operator!=(local_590,&local_630);
            if (bVar2) break;
            pVar10 = std::
                     set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     ::insert((set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                              (value_type *)in_stack_fffffffffffff588._M_current);
            in_stack_fffffffffffff600 = pVar10.first._M_node;
            in_stack_fffffffffffff5ff = pVar10.second;
            local_6a8 = in_stack_fffffffffffff600._M_node;
            local_6a0 = in_stack_fffffffffffff5ff;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff580._M_current);
            local_598 = local_598 + 1;
          }
          poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
          getName_abi_cxx11_((MoleculeStamp *)
                             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
          poVar6 = std::operator<<(poVar6,local_650);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,"Bend");
          containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff718);
          poVar6 = std::operator<<(poVar6,local_670);
          std::operator<<(poVar6," appears multiple times\n");
          std::__cxx11::string::~string(local_670);
          std::__cxx11::string::~string(local_650);
          local_691 = 1;
          uVar7 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException
                    ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                     (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
          local_691 = 0;
          __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_498 = getBendStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
        BendStamp::getMembers
                  ((BendStamp *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        getNRigidBodies((MoleculeStamp *)0x326cb4);
        local_4cc = 0;
        std::allocator<int>::allocator((allocator<int> *)0x326cde);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                   (size_type)in_stack_fffffffffffff588._M_current,
                   in_stack_fffffffffffff580._M_current,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        std::allocator<int>::~allocator((allocator<int> *)0x326d12);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
        __normal_iterator(&local_4d8);
        local_4e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568))
        ;
        local_4d8._M_current = local_4e0;
        while( true ) {
          local_4e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568
                                                ));
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff570,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
          if (!bVar2) break;
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_4d8);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d8),(long)*piVar8);
          local_4ec = *pvVar9;
          if (-1 < local_4ec) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_4c8,(long)local_4ec);
            *pvVar9 = *pvVar9 + 1;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_4c8,(long)local_4ec);
            if (2 < *pvVar9) {
              poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
              getName_abi_cxx11_((MoleculeStamp *)
                                 CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
              poVar6 = std::operator<<(poVar6,local_510);
              poVar6 = std::operator<<(poVar6,": bend");
              containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff718);
              poVar6 = std::operator<<(poVar6,local_530);
              std::operator<<(poVar6,"has three atoms on the same rigid body\n");
              std::__cxx11::string::~string(local_530);
              std::__cxx11::string::~string(local_510);
              local_551 = 1;
              uVar7 = __cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              OpenMDException::OpenMDException
                        ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                         (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
              local_551 = 0;
              __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_4d8);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff580._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff580._M_current);
        local_490 = local_490 + 1;
      } while( true );
    }
    local_1a0 = getBendStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
    BendStamp::getMembers
              ((BendStamp *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    sVar4 = getNAtoms((MoleculeStamp *)0x325cfc);
    local_1f0 = sVar4 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
               (_Placeholder<1> *)in_stack_fffffffffffff570,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    __last_00._M_current._7_1_ = in_stack_fffffffffffff5a7;
    __last_00._M_current._0_7_ = in_stack_fffffffffffff5a0;
    local_1c0 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                 (in_stack_fffffffffffff5a8,__last_00,
                                  in_stack_fffffffffffff598._M_current);
    local_200 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    local_208 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    local_218 = 0;
    std::bind<std::less<int>,std::_Placeholder<1>const&,int>
              ((less<int> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
               (_Placeholder<1> *)in_stack_fffffffffffff570,
               (int *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    __last._M_current._4_4_ = in_stack_fffffffffffff594;
    __last._M_current._0_4_ = in_stack_fffffffffffff590;
    local_1f8 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                                 (in_stack_fffffffffffff598,__last,
                                  in_stack_fffffffffffff588._M_current);
    local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff570,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    local_7e1 = true;
    if (!bVar2) {
      local_228 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      local_7e1 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff570,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    }
    if (local_7e1 != false) {
      poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
      getName_abi_cxx11_((MoleculeStamp *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      poVar6 = std::operator<<(poVar6,local_248);
      poVar6 = std::operator<<(poVar6," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff718);
      poVar6 = std::operator<<(poVar6,local_268);
      std::operator<<(poVar6," have invalid indices\n");
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_248);
      local_289 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                 (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
      local_289 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    bVar2 = hasDuplicateElement<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff610);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
      getName_abi_cxx11_((MoleculeStamp *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      poVar6 = std::operator<<(poVar6,local_2b0);
      poVar6 = std::operator<<(poVar6," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff718);
      poVar6 = std::operator<<(poVar6,local_2d0);
      std::operator<<(poVar6," have duplicated indices\n");
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2b0);
      local_2f1 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                 (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
      local_2f1 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1b8);
    if (sVar5 == 2) {
      bVar2 = BendStamp::haveGhostVectorSource((BendStamp *)0x3262d3);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        poVar6 = std::operator<<(poVar6,local_318);
        std::operator<<(poVar6,": ghostVectorSouce is missing\n");
        std::__cxx11::string::~string(local_318);
        local_339 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                   (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        local_339 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      iVar3 = BendStamp::getGhostVectorSource((BendStamp *)0x32645c);
      local_348 = (long)iVar3;
      sVar4 = getNAtoms((MoleculeStamp *)0x326493);
      if (sVar4 <= (ulong)(long)iVar3) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        poVar6 = std::operator<<(poVar6,local_418);
        poVar6 = std::operator<<(poVar6,": ghostVectorSource ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_348);
        std::operator<<(poVar6,"  is invalid\n");
        std::__cxx11::string::~string(local_418);
        local_439 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                   (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        local_439 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      local_358 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      local_360 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      local_350 = (int *)std::
                         find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long>
                                   (in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                                    (unsigned_long *)
                                    CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
      local_368 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff570,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        poVar6 = std::operator<<(poVar6,local_388);
        poVar6 = std::operator<<(poVar6,": ghostVectorSouce ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_348);
        std::operator<<(poVar6,"is invalid\n");
        std::__cxx11::string::~string(local_388);
        local_3a9 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                   (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        local_3a9 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      this_00 = getAtomStamp(in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
      bVar2 = AtomStamp::haveOrientation(this_00);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        poVar6 = std::operator<<(poVar6,local_3d0);
        std::operator<<(poVar6,": ghost atom must be a directional atom\n");
        std::__cxx11::string::~string(local_3d0);
        local_3f1 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                   (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        local_3f1 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    else {
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1b8);
      if ((sVar5 == 3) && (bVar2 = BendStamp::haveGhostVectorSource((BendStamp *)0x326a67), bVar2))
      {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
        poVar6 = std::operator<<(poVar6,local_460);
        std::operator<<(poVar6,": normal bend should not have ghostVectorSouce\n");
        std::__cxx11::string::~string(local_460);
        local_481 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff580._M_current,
                   (string *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
        local_481 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff580._M_current);
    local_188 = local_188 + 1;
  } while( true );
}

Assistant:

void MoleculeStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Molecule " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Molecule " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Molecule " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Molecule " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Molecule " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Molecule " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure the first element of bendTuple is always less than or equal
      // to the third element of bendTuple
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();

      AtomStamp* atomA = getAtomStamp(a);
      AtomStamp* atomB = getAtomStamp(b);

      // find bend c--a--b
      AtomStamp::AtomIter ai;
      for (int c = atomA->getFirstBondedAtom(ai); c != -1;
           c     = atomA->getNextBondedAtom(ai)) {
        if (b == c) continue;

        std::tuple<int, int, int> newBend {c, a, b};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }

      // find bend a--b--c
      for (int c = atomB->getFirstBondedAtom(ai); c != -1;
           c     = atomB->getNextBondedAtom(ai)) {
        if (a == c) continue;

        std::tuple<int, int, int> newBend {a, b, c};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }
    }
  }